

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::Initialize
          (TPZNodeRep<1,_pztopology::TPZPoint> *this,TPZVec<long> *nodeindexes)

{
  int64_t iVar1;
  ostream *poVar2;
  char *pcVar3;
  long *__src;
  TPZVec<long> *in_RSI;
  long in_RDI;
  int64_t i;
  stringstream sout;
  size_t in_stack_000001f8;
  char *in_stack_00000200;
  int64_t nn;
  int64_t local_1e8;
  long local_1d8;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int64_t local_18;
  TPZVec<long> *local_10;
  
  local_10 = in_RSI;
  iVar1 = TPZVec<long>::NElements(in_RSI);
  if (iVar1 < 1) {
    local_1e8 = TPZVec<long>::NElements(local_10);
  }
  else {
    local_1e8 = 1;
  }
  local_18 = local_1e8;
  iVar1 = TPZVec<long>::NElements(local_10);
  if (iVar1 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,
                             "void pzgeom::TPZNodeRep<1, pztopology::TPZPoint>::Initialize(TPZVec<int64_t> &) [N = 1, Topology = pztopology::TPZPoint]"
                            );
    poVar2 = std::operator<<(poVar2," Nodeindexes have wrong size ");
    iVar1 = TPZVec<long>::NElements(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," but should be ");
    std::ostream::operator<<(poVar2,1);
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    pzinternal::DebugStopImpl(in_stack_00000200,in_stack_000001f8);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  __src = TPZVec<long>::operator[](local_10,0);
  memcpy((void *)(in_RDI + 8),__src,local_18 << 3);
  for (local_1d8 = local_18; local_1d8 < 1; local_1d8 = local_1d8 + 1) {
    *(undefined8 *)(in_RDI + 8 + local_1d8 * 8) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void Initialize(TPZVec<int64_t> &nodeindexes)
        {
            int64_t nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifndef PZNODEBUG
            if(nodeindexes.NElements() != N)
            {
                std::stringstream sout;
                sout << __PRETTY_FUNCTION__ << " Nodeindexes have wrong size " << nodeindexes.NElements() << " but should be " << N;
                std::cout << sout.str().c_str() << std::endl;
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int64_t i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
            
        }